

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_0::FdConnectionReceiver::acceptImpl(FdConnectionReceiver *this,bool authenticated)

{
  UnixEventPort *params;
  ArrayDisposer *filter;
  AsyncIoStream *stream;
  byte bVar1;
  int fd;
  AuthenticatedStream *pAVar2;
  uint *puVar3;
  byte in_DL;
  undefined7 in_register_00000031;
  Exception *pEVar4;
  Fault local_208;
  Fault f_1;
  undefined1 local_1f0 [20];
  int error_1;
  SocketAddress local_1c0;
  undefined1 local_138 [24];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  AuthenticatedStream result;
  Fault f;
  undefined1 auStack_d0 [4];
  int error;
  undefined8 local_c8;
  undefined4 local_c0;
  int local_bc;
  int _kjSyscallError;
  int one;
  OwnFd local_a8;
  socklen_t local_a4;
  OwnFd ownFd;
  socklen_t addrlen;
  sockaddr_storage addr;
  int newFd;
  bool authenticated_local;
  FdConnectionReceiver *this_local;
  
  pEVar4 = (Exception *)CONCAT71(in_register_00000031,authenticated);
  local_a4 = 0x80;
  do {
    do {
      fd = accept4((int)(pEVar4->ownFile).content.size_,(sockaddr *)&ownFd,&local_a4,0x80800);
      if (-1 < fd) {
        OwnFd::OwnFd(&local_a8,fd);
        bVar1 = (**(code **)**(undefined8 **)&pEVar4->line)
                          (*(undefined8 **)&pEVar4->line,&ownFd,local_a4);
        if ((bVar1 & 1) == 0) {
          acceptImpl(this,authenticated);
          _kjSyscallError = 1;
        }
        else {
          local_bc = 1;
          _auStack_d0 = &local_a8;
          local_c8 = &local_bc;
          local_c0 = kj::_::Debug::
                     syscallError<kj::(anonymous_namespace)::FdConnectionReceiver::acceptImpl(bool)::_lambda()_1_>
                               ((anon_class_16_2_1fdc082b *)auStack_d0,false);
          if (((local_c0 != 0) && (local_c0 != 0x5c)) && (local_c0 != 0x5f)) {
            kj::_::Debug::Fault::Fault
                      ((Fault *)&result.peerIdentity.ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                       ,0x555,local_c0,"setsocketopt(IPPROTO_TCP, TCP_NODELAY)","");
            kj::_::Debug::Fault::fatal((Fault *)&result.peerIdentity.ptr);
          }
          AuthenticatedStream::AuthenticatedStream((AuthenticatedStream *)local_100);
          params = (UnixEventPort *)pEVar4->file;
          local_138._20_4_ = OwnFd::release(&local_a8);
          local_138._16_4_ = 3;
          heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int,unsigned_int_const&,kj::UnixEventPort::FdObserver::Flags>
                    ((kj *)local_120,params,(int *)(local_138 + 0x14),
                     &(anonymous_namespace)::NEW_FD_FLAGS,(Flags *)(local_138 + 0x10));
          Own<kj::AsyncIoStream,decltype(nullptr)>::
          Own<kj::(anonymous_namespace)::AsyncStreamFd,void>
                    ((Own<kj::AsyncIoStream,decltype(nullptr)> *)(local_120 + 0x10),
                     (Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)local_120);
          Own<kj::AsyncIoStream,_std::nullptr_t>::operator=
                    ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_100,
                     (Own<kj::AsyncIoStream,_std::nullptr_t> *)(local_120 + 0x10));
          Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
                    ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(local_120 + 0x10));
          Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::~Own
                    ((Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)local_120);
          if ((in_DL & 1) != 0) {
            SocketAddress::SocketAddress(&local_1c0,&ownFd,local_a4);
            filter = (pEVar4->ownFile).content.disposer;
            stream = *(AsyncIoStream **)&pEVar4->line;
            Own<kj::AsyncIoStream,_std::nullptr_t>::operator*
                      ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_100);
            SocketAddress::getIdentity
                      ((SocketAddress *)local_138,(LowLevelAsyncIoProvider *)&local_1c0,
                       (NetworkFilter *)filter,stream);
            Own<kj::PeerIdentity,_std::nullptr_t>::operator=
                      ((Own<kj::PeerIdentity,_std::nullptr_t> *)&result.stream.ptr,
                       (Own<kj::PeerIdentity,_std::nullptr_t> *)local_138);
            Own<kj::PeerIdentity,_std::nullptr_t>::~Own
                      ((Own<kj::PeerIdentity,_std::nullptr_t> *)local_138);
          }
          pAVar2 = mv<kj::AuthenticatedStream>((AuthenticatedStream *)local_100);
          AuthenticatedStream::AuthenticatedStream((AuthenticatedStream *)(local_1f0 + 0x10),pAVar2)
          ;
          Promise<kj::AuthenticatedStream>::Promise
                    ((Promise<kj::AuthenticatedStream> *)this,
                     (AuthenticatedStream *)(local_1f0 + 0x10));
          AuthenticatedStream::~AuthenticatedStream((AuthenticatedStream *)(local_1f0 + 0x10));
          _kjSyscallError = 1;
          AuthenticatedStream::~AuthenticatedStream((AuthenticatedStream *)local_100);
        }
        OwnFd::~OwnFd(&local_a8);
        return (PromiseBase)(PromiseBase)this;
      }
      puVar3 = (uint *)__errno_location();
      local_1f0._12_4_ = *puVar3;
    } while (local_1f0._12_4_ == 4);
    if (local_1f0._12_4_ == 0xb) {
      UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_1f0);
      f_1.exception = pEVar4;
      Promise<void>::
      then<kj::(anonymous_namespace)::FdConnectionReceiver::acceptImpl(bool)::_lambda()_2_>
                ((Promise<void> *)this,(Type *)local_1f0);
      Promise<void>::~Promise((Promise<void> *)local_1f0);
      return (PromiseBase)(PromiseBase)this;
    }
  } while (((local_1f0._12_4_ == 0x47) || (local_1f0._12_4_ - 100 < 2)) ||
          ((local_1f0._12_4_ == 0x67 ||
           ((local_1f0._12_4_ == 0x6e || (local_1f0._12_4_ - 0x70 < 2))))));
  kj::_::Debug::Fault::Fault
            (&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x580,local_1f0._12_4_,"accept","");
  kj::_::Debug::Fault::fatal(&local_208);
}

Assistant:

Promise<AuthenticatedStream> acceptImpl(bool authenticated) {
    int newFd;

    struct sockaddr_storage addr;
    socklen_t addrlen = sizeof(addr);

  retry:
#if __linux__ && !__BIONIC__
    newFd = ::accept4(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen,
                      SOCK_NONBLOCK | SOCK_CLOEXEC);
#else
    newFd = ::accept(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen);
#endif

    if (newFd >= 0) {
      kj::OwnFd ownFd(newFd);
      if (!filter.shouldAllow(reinterpret_cast<struct sockaddr*>(&addr), addrlen)) {
        // Ignore disallowed address.
        return acceptImpl(authenticated);
      } else {
        // TODO(perf):  As a hack for the 0.4 release we are always setting
        //   TCP_NODELAY because Nagle's algorithm pretty much kills Cap'n Proto's
        //   RPC protocol.  Later, we should extend the interface to provide more
        //   control over this.  Perhaps write() should have a flag which
        //   specifies whether to pass MSG_MORE.
        int one = 1;
        KJ_SYSCALL_HANDLE_ERRORS(::setsockopt(
              ownFd.get(), IPPROTO_TCP, TCP_NODELAY, (char*)&one, sizeof(one))) {
          case EOPNOTSUPP:
          case ENOPROTOOPT: // (returned for AF_UNIX in cygwin)
#if __FreeBSD__
          case EINVAL: // (returned for AF_UNIX in FreeBSD)
#endif
            break;
          default:
            KJ_FAIL_SYSCALL("setsocketopt(IPPROTO_TCP, TCP_NODELAY)", error);
        }

        AuthenticatedStream result;
        result.stream = heap<AsyncStreamFd>(eventPort, ownFd.release(), NEW_FD_FLAGS,
                                            UnixEventPort::FdObserver::OBSERVE_READ_WRITE);
        if (authenticated) {
          result.peerIdentity = SocketAddress(reinterpret_cast<struct sockaddr*>(&addr), addrlen)
              .getIdentity(lowLevel, filter, *result.stream);
        }
        return kj::mv(result);
      }
    } else {
      int error = errno;

      switch (error) {
        case EAGAIN:
#if EAGAIN != EWOULDBLOCK
        case EWOULDBLOCK:
#endif
          // Not ready yet.
          return observer.whenBecomesReadable().then([this,authenticated]() {
            return acceptImpl(authenticated);
          });

        case EINTR:
        case ENETDOWN:
#ifdef EPROTO
        // EPROTO is not defined on OpenBSD.
        case EPROTO:
#endif
        case EHOSTDOWN:
        case EHOSTUNREACH:
        case ENETUNREACH:
        case ECONNABORTED:
        case ETIMEDOUT:
          // According to the Linux man page, accept() may report an error if the accepted
          // connection is already broken.  In this case, we really ought to just ignore it and
          // keep waiting.  But it's hard to say exactly what errors are such network errors and
          // which ones are permanent errors.  We've made a guess here.
          goto retry;

        default:
          KJ_FAIL_SYSCALL("accept", error);
      }

    }
  }